

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wskey.cpp
# Opt level: O3

string * __thiscall
pstore::http::sha1::digest_to_base64_abi_cxx11_
          (string *__return_storage_ptr__,sha1 *this,result_type *digest)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  to_base64<unsigned_char_const*,std::back_insert_iterator<std::__cxx11::string>>
            ((uchar *)this,&this->field_0x14,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string sha1::digest_to_base64 (sha1::result_type const & digest) {
            std::string result;
            to_base64 (std::begin (digest), std::end (digest), std::back_inserter (result));
            return result;
        }